

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::IRContext(IRContext *this,spv_target_env env,MessageConsumer *c)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  spv_context psVar4;
  Module *this_00;
  undefined1 auVar5 [16];
  _Any_data local_40;
  code *local_30;
  
  psVar4 = spvContextCreate(env);
  this->syntax_context_ = psVar4;
  (this->grammar_).target_env_ = psVar4->target_env;
  uVar2 = psVar4->opcode_table;
  uVar3 = psVar4->operand_table;
  auVar5._8_4_ = (int)uVar2;
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = (int)((ulong)uVar2 >> 0x20);
  (this->grammar_).operandTable_ = (spv_operand_table)uVar3;
  (this->grammar_).opcodeTable_ = (spv_opcode_table)auVar5._8_8_;
  (this->grammar_).extInstTable_ = psVar4->ext_inst_table;
  this->unique_id_ = 0;
  this_00 = (Module *)::operator_new(0x590);
  Module::Module(this_00);
  (this->module_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
  super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl = this_00;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&this->consumer_,c);
  (this->feature_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
       (FeatureManager *)0x0;
  this->def_use_mgr_ =
       (__uniq_ptr_data<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>,_true,_true>
        )0x0;
  this->decoration_mgr_ =
       (__uniq_ptr_data<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>,_true,_true>
        )0x0;
  (this->instr_to_block_)._M_h._M_buckets = &(this->instr_to_block_)._M_h._M_single_bucket;
  (this->instr_to_block_)._M_h._M_bucket_count = 1;
  (this->instr_to_block_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->instr_to_block_)._M_h._M_element_count = 0;
  (this->instr_to_block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->instr_to_block_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->id_to_func_)._M_h._M_buckets = &(this->id_to_func_)._M_h._M_single_bucket;
  (this->id_to_func_)._M_h._M_bucket_count = 1;
  (this->id_to_func_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->id_to_func_)._M_h._M_element_count = 0;
  (this->id_to_func_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->valid_analyses_ = kAnalysisNone;
  *(undefined1 (*) [16])&(this->id_to_func_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->combinator_ops_)._M_h._M_buckets = &(this->combinator_ops_)._M_h._M_single_bucket;
  (this->combinator_ops_)._M_h._M_bucket_count = 1;
  (this->combinator_ops_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->combinator_ops_)._M_h._M_element_count = 0;
  (this->combinator_ops_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->combinator_ops_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->builtin_var_id_map_)._M_h._M_buckets = &(this->builtin_var_id_map_)._M_h._M_single_bucket;
  (this->builtin_var_id_map_)._M_h._M_bucket_count = 1;
  (this->builtin_var_id_map_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->builtin_var_id_map_)._M_h._M_element_count = 0;
  (this->builtin_var_id_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined1 (*) [16])&(this->builtin_var_id_map_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->cfg_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
  super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl = (CFG *)0x0;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->loop_descriptors_)._M_h._M_buckets = &(this->loop_descriptors_)._M_h._M_single_bucket;
  (this->loop_descriptors_)._M_h._M_bucket_count = 1;
  (this->loop_descriptors_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->loop_descriptors_)._M_h._M_element_count = 0;
  (this->loop_descriptors_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->loop_descriptors_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->constant_mgr_ =
       (__uniq_ptr_data<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>,_true,_true>
        )0x0;
  this->type_mgr_ =
       (__uniq_ptr_data<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>,_true,_true>
        )0x0;
  this->debug_info_mgr_ =
       (__uniq_ptr_data<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>,_true,_true>
        )0x0;
  this->id_to_name_ =
       (__uniq_ptr_data<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>,_true,_true>
        )0x0;
  this->scalar_evolution_analysis_ =
       (__uniq_ptr_data<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>,_true,_true>
        )0x0;
  this->reg_pressure_ =
       (__uniq_ptr_data<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>,_true,_true>
        )0x0;
  this->vn_table_ =
       (__uniq_ptr_data<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>,_true,_true>
        )0x0;
  this->inst_folder_ =
       (__uniq_ptr_data<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>,_true,_true>
        )0x0;
  this->struct_cfg_analysis_ =
       (__uniq_ptr_data<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>,_true,_true>
        )0x0;
  this->liveness_mgr_ =
       (__uniq_ptr_data<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>,_true,_true>
        )0x0;
  this->max_id_bound_ = 0x3fffff;
  this->preserve_bindings_ = false;
  this->preserve_spec_constants_ = false;
  psVar4 = this->syntax_context_;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            *)&local_40,&this->consumer_);
  SetContextMessageConsumer(psVar4,(MessageConsumer *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  ((this->module_)._M_t.
   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
   super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->context_ = this;
  return;
}

Assistant:

IRContext(spv_target_env env, MessageConsumer c)
      : syntax_context_(spvContextCreate(env)),
        grammar_(syntax_context_),
        unique_id_(0),
        module_(new Module()),
        consumer_(std::move(c)),
        def_use_mgr_(nullptr),
        feature_mgr_(nullptr),
        valid_analyses_(kAnalysisNone),
        constant_mgr_(nullptr),
        type_mgr_(nullptr),
        id_to_name_(nullptr),
        max_id_bound_(kDefaultMaxIdBound),
        preserve_bindings_(false),
        preserve_spec_constants_(false) {
    SetContextMessageConsumer(syntax_context_, consumer_);
    module_->SetContext(this);
  }